

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldriver.cpp
# Opt level: O2

QString * __thiscall
QSqlDriver::stripDelimiters
          (QString *__return_storage_ptr__,QSqlDriver *this,QString *identifier,IdentifierType type)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar4 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type);
  if (cVar4 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QString::operator=(__return_storage_ptr__,identifier);
      return __return_storage_ptr__;
    }
  }
  else {
    QString::mid((longlong)&local_48,(longlong)identifier);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QString::chop((longlong)__return_storage_ptr__);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlDriver::stripDelimiters(const QString &identifier, IdentifierType type) const
{
    QString ret;
    if (isIdentifierEscaped(identifier, type)) {
        ret = identifier.mid(1);
        ret.chop(1);
    } else {
        ret = identifier;
    }
    return ret;
}